

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

int4 functionalEqualityLevel(Varnode *vn1,Varnode *vn2,Varnode **res1,Varnode **res2)

{
  bool bVar1;
  OpCode OVar2;
  OpCode OVar3;
  int4 iVar4;
  int4 iVar5;
  PcodeOp *this;
  PcodeOp *this_00;
  Address *this_01;
  Address *op2_00;
  Varnode *pVVar6;
  uintb uVar7;
  uintb uVar8;
  Varnode *tmpvn;
  int4 comm2;
  int4 comm1;
  int4 unmatchsize;
  int4 testval2;
  int4 i;
  int4 num;
  OpCode opc;
  PcodeOp *op2;
  PcodeOp *op1;
  int4 testval;
  Varnode **res2_local;
  Varnode **res1_local;
  Varnode *vn2_local;
  Varnode *vn1_local;
  
  vn1_local._4_4_ = functionalEqualityLevel0(vn1,vn2);
  if (vn1_local._4_4_ == 1) {
    this = Varnode::getDef(vn1);
    this_00 = Varnode::getDef(vn2);
    OVar2 = PcodeOp::code(this);
    OVar3 = PcodeOp::code(this_00);
    if (OVar2 == OVar3) {
      testval2 = PcodeOp::numInput(this);
      iVar4 = PcodeOp::numInput(this_00);
      if (testval2 == iVar4) {
        bVar1 = PcodeOp::isMarker(this);
        if (bVar1) {
          vn1_local._4_4_ = -1;
        }
        else {
          bVar1 = PcodeOp::isCall(this_00);
          if (bVar1) {
            vn1_local._4_4_ = -1;
          }
          else {
            if (OVar2 == CPUI_LOAD) {
              this_01 = PcodeOp::getAddr(this);
              op2_00 = PcodeOp::getAddr(this_00);
              bVar1 = Address::operator!=(this_01,op2_00);
              if (bVar1) {
                return -1;
              }
            }
            if (2 < testval2) {
              if (OVar2 != CPUI_PTRADD) {
                return -1;
              }
              pVVar6 = PcodeOp::getIn(this,2);
              uVar7 = Varnode::getOffset(pVVar6);
              pVVar6 = PcodeOp::getIn(this_00,2);
              uVar8 = Varnode::getOffset(pVVar6);
              if (uVar7 != uVar8) {
                return -1;
              }
              testval2 = 2;
            }
            for (unmatchsize = 0; unmatchsize < testval2; unmatchsize = unmatchsize + 1) {
              pVVar6 = PcodeOp::getIn(this,unmatchsize);
              res1[unmatchsize] = pVVar6;
              pVVar6 = PcodeOp::getIn(this_00,unmatchsize);
              res2[unmatchsize] = pVVar6;
            }
            vn1_local._4_4_ = functionalEqualityLevel0(*res1,*res2);
            if (vn1_local._4_4_ == 0) {
              if (testval2 == 1) {
                vn1_local._4_4_ = 0;
              }
              else {
                iVar4 = functionalEqualityLevel0(res1[1],res2[1]);
                if (iVar4 == 0) {
                  vn1_local._4_4_ = 0;
                }
                else if (iVar4 < 0) {
                  vn1_local._4_4_ = -1;
                }
                else {
                  *res1 = res1[1];
                  *res2 = res2[1];
                  vn1_local._4_4_ = 1;
                }
              }
            }
            else if ((testval2 != 1) &&
                    (iVar4 = functionalEqualityLevel0(res1[1],res2[1]), iVar4 != 0)) {
              if ((vn1_local._4_4_ == 1) && (iVar4 == 1)) {
                comm2 = 2;
              }
              else {
                comm2 = -1;
              }
              bVar1 = PcodeOp::isCommutative(this);
              if (bVar1) {
                iVar4 = functionalEqualityLevel0(*res1,res2[1]);
                iVar5 = functionalEqualityLevel0(res1[1],*res2);
                if ((iVar4 == 0) && (iVar5 == 0)) {
                  vn1_local._4_4_ = 0;
                }
                else if ((iVar4 < 0) || (iVar5 < 0)) {
                  vn1_local._4_4_ = comm2;
                }
                else if (iVar4 == 0) {
                  *res1 = res1[1];
                  vn1_local._4_4_ = 1;
                }
                else if (iVar5 == 0) {
                  *res2 = res2[1];
                  vn1_local._4_4_ = 1;
                }
                else if (comm2 == 2) {
                  vn1_local._4_4_ = 2;
                }
                else {
                  pVVar6 = *res2;
                  *res2 = res2[1];
                  res2[1] = pVVar6;
                  vn1_local._4_4_ = 2;
                }
              }
              else {
                vn1_local._4_4_ = comm2;
              }
            }
          }
        }
      }
      else {
        vn1_local._4_4_ = -1;
      }
    }
    else {
      vn1_local._4_4_ = -1;
    }
  }
  return vn1_local._4_4_;
}

Assistant:

int4 functionalEqualityLevel(Varnode *vn1,Varnode *vn2,Varnode **res1,Varnode **res2)

{
  int4 testval = functionalEqualityLevel0(vn1,vn2);
  if (testval != 1) return testval;
  PcodeOp *op1 = vn1->getDef();
  PcodeOp *op2 = vn2->getDef();
  OpCode opc = op1->code();

  if (opc != op2->code()) return -1;

  int4 num = op1->numInput();
  if (num != op2->numInput()) return -1;
  if (op1->isMarker()) return -1;
  if (op2->isCall()) return -1;
  if (opc == CPUI_LOAD) {
				// FIXME: We assume two loads produce the same
				// result if the address is the same and the loads
				// occur in the same instruction
    if (op1->getAddr() != op2->getAddr()) return -1;
  }
  if (num >= 3) {
    if (opc != CPUI_PTRADD) return -1; // If this is a PTRADD
    if (op1->getIn(2)->getOffset() != op2->getIn(2)->getOffset()) return -1; // Make sure the elsize constant is equal
    num = 2;			// Otherwise treat as having 2 inputs
  }
  for(int4 i=0;i<num;++i) {
    res1[i] = op1->getIn(i);
    res2[i] = op2->getIn(i);
  }

  testval = functionalEqualityLevel0(res1[0],res2[0]);
  if (testval == 0) {	      	// A match locks in this comparison ordering
    if (num==1) return 0;
    testval = functionalEqualityLevel0(res1[1],res2[1]);
    if (testval==0) return 0;
    if (testval < 0) return -1;
    res1[0] = res1[1];		// Match is contingent on second pair
    res2[0] = res2[1];
    return 1;
  }
  if (num == 1) return testval;
  int4 testval2 = functionalEqualityLevel0(res1[1],res2[1]);
  if (testval2 == 0) {		// A match locks in this comparison ordering
    return testval;
  }
  int4 unmatchsize;
  if ((testval==1)&&(testval2==1))
    unmatchsize = 2;
  else
    unmatchsize = -1;

  if (!op1->isCommutative()) return unmatchsize;
  // unmatchsize must be 2 or -1 here on a commutative operator,
  // try flipping
  int4 comm1 = functionalEqualityLevel0(res1[0],res2[1]);
  int4 comm2 = functionalEqualityLevel0(res1[1],res2[0]);
  if ((comm1==0) && (comm2==0))
    return 0;
  if ((comm1<0)||(comm2<0))
    return unmatchsize;
  if (comm1==0)	{		// AND (comm2==1)
    res1[0] = res1[1];		// Left over unmatch is res1[1] and res2[0]
    return 1;
  }
  if (comm2==0) {		// AND (comm1==1)
    res2[0] = res2[1];		// Left over unmatch is res1[0] and res2[1]
    return 1;
  }
  // If we reach here (comm1==1) AND (comm2==1)
  if (unmatchsize == 2)		// If the original ordering wasn't impossible
    return 2;			// Prefer the original ordering
  Varnode *tmpvn = res2[0];	// Otherwise swap the ordering
  res2[0] = res2[1];
  res2[1] = tmpvn;
  return 2;
}